

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestOrderOnlyDeps::Run(BuildTestOrderOnlyDeps *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  reference ppEVar5;
  Node *pNVar6;
  size_type sVar7;
  reference ppNVar8;
  string *psVar9;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  value_type local_58;
  Edge *edge;
  int local_34;
  undefined1 local_30 [4];
  int fail_count;
  string err;
  BuildTestOrderOnlyDeps *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  local_34 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&edge + 4));
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cc\n  command = cc $in\n  depfile = $out.d\nbuild foo.o: cc foo.c || otherfile\n"
              ,stack0xffffffffffffffb4);
  iVar2 = local_34;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::back
                        (&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_);
    local_58 = *ppEVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"foo.c",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_78,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"otherfile",&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_c8,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"foo.o.d",&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"foo.o: blah.h bar.h\n",&local_141);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_118,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"foo.o",&local_169);
    pNVar6 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_168,(string *)local_30);
    testing::Test::Check
              (pTVar1,pNVar6 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x3f9,"builder_.AddTarget(\"foo.o\", &err)");
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3fa,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      sVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_58->inputs_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar7 == 4,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x3fd,"4u == edge->inputs_.size()");
      if (bVar3) {
        testing::Test::Check
                  (g_current_test,local_58->implicit_deps_ == 2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3fe,"2 == edge->implicit_deps_");
        testing::Test::Check
                  (g_current_test,local_58->order_only_deps_ == 1,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3ff,"1 == edge->order_only_deps_");
        pTVar1 = g_current_test;
        ppNVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->inputs_,0);
        psVar9 = Node::path_abi_cxx11_(*ppNVar8);
        bVar3 = std::operator==("foo.c",psVar9);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x402,"\"foo.c\" == edge->inputs_[0]->path()");
        pTVar1 = g_current_test;
        ppNVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->inputs_,1);
        psVar9 = Node::path_abi_cxx11_(*ppNVar8);
        bVar3 = std::operator==("blah.h",psVar9);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x403,"\"blah.h\" == edge->inputs_[1]->path()");
        pTVar1 = g_current_test;
        ppNVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->inputs_,2);
        psVar9 = Node::path_abi_cxx11_(*ppNVar8);
        bVar3 = std::operator==("bar.h",psVar9);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x404,"\"bar.h\" == edge->inputs_[2]->path()");
        pTVar1 = g_current_test;
        ppNVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->inputs_,3);
        psVar9 = Node::path_abi_cxx11_(*ppNVar8);
        bVar3 = std::operator==("otherfile",psVar9);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x405,"\"otherfile\" == edge->inputs_[3]->path()");
        pTVar1 = g_current_test;
        Edge::EvaluateCommand_abi_cxx11_(&local_190,local_58,false);
        bVar3 = std::operator==("cc foo.c",&local_190);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x408,"\"cc foo.c\" == edge->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_190);
        pTVar1 = g_current_test;
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
          testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x40b,"builder_.Build(&err)");
          pTVar1 = g_current_test;
          bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_30);
          bVar3 = testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x40c,"\"\" == err");
          pTVar1 = g_current_test;
          if (bVar3) {
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
            bVar3 = testing::Test::Check
                              (pTVar1,sVar7 == 1,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0x40d,"1u == command_runner_.commands_ran_.size()");
            if (bVar3) {
              VirtualFileSystem::Tick(&(this->super_BuildTest).fs_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b0,"foo.o.d",&local_1b1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d8,"foo.o: blah.h bar.h\n",&local_1d9);
              VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_1b0,&local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
              std::allocator<char>::~allocator(&local_1d9);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::allocator<char>::~allocator(&local_1b1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_200,"blah.h",&local_201);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_229)
              ;
              VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_200,&local_228);
              std::__cxx11::string::~string((string *)&local_228);
              std::allocator<char>::~allocator(&local_229);
              std::__cxx11::string::~string((string *)&local_200);
              std::allocator<char>::~allocator(&local_201);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_250,"bar.h",&local_251);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_279)
              ;
              VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_250,&local_278);
              std::__cxx11::string::~string((string *)&local_278);
              std::allocator<char>::~allocator(&local_279);
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator(&local_251);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&(this->super_BuildTest).command_runner_.commands_ran_);
              State::Reset(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_);
              pTVar1 = g_current_test;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2a0,"foo.o",&local_2a1);
              pNVar6 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_2a0,
                                          (string *)local_30);
              testing::Test::Check
                        (pTVar1,pNVar6 != (Node *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x419,"builder_.AddTarget(\"foo.o\", &err)");
              std::__cxx11::string::~string((string *)&local_2a0);
              std::allocator<char>::~allocator(&local_2a1);
              pTVar1 = g_current_test;
              bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
              testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x41a,"builder_.Build(&err)");
              pTVar1 = g_current_test;
              bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_30);
              bVar3 = testing::Test::Check
                                (pTVar1,bVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                 ,0x41b,"\"\" == err");
              pTVar1 = g_current_test;
              if (bVar3) {
                sVar7 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
                bVar3 = testing::Test::Check
                                  (pTVar1,sVar7 == 1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                   ,0x41c,"1u == command_runner_.commands_ran_.size()");
                if (bVar3) {
                  VirtualFileSystem::Tick(&(this->super_BuildTest).fs_);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2c8,"foo.o.d",&local_2c9);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2f0,"foo.o: blah.h bar.h\n",&local_2f1);
                  VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_2c8,&local_2f0);
                  std::__cxx11::string::~string((string *)&local_2f0);
                  std::allocator<char>::~allocator(&local_2f1);
                  std::__cxx11::string::~string((string *)&local_2c8);
                  std::allocator<char>::~allocator(&local_2c9);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_318,"otherfile",&local_319);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_340,"",&local_341);
                  VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_318,&local_340);
                  std::__cxx11::string::~string((string *)&local_340);
                  std::allocator<char>::~allocator(&local_341);
                  std::__cxx11::string::~string((string *)&local_318);
                  std::allocator<char>::~allocator(&local_319);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&(this->super_BuildTest).command_runner_.commands_ran_);
                  State::Reset(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_);
                  pTVar1 = g_current_test;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_368,"foo.o",&local_369);
                  pNVar6 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_368,
                                              (string *)local_30);
                  testing::Test::Check
                            (pTVar1,pNVar6 != (Node *)0x0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x427,"builder_.AddTarget(\"foo.o\", &err)");
                  std::__cxx11::string::~string((string *)&local_368);
                  std::allocator<char>::~allocator(&local_369);
                  pTVar1 = g_current_test;
                  bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_30);
                  testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x428,"\"\" == err");
                  pTVar1 = g_current_test;
                  bVar3 = Builder::AlreadyUpToDate(&(this->super_BuildTest).builder_);
                  testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x429,"builder_.AlreadyUpToDate()");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_390,"bar.h",&local_391);
                  VirtualFileSystem::RemoveFile(&(this->super_BuildTest).fs_,&local_390);
                  std::__cxx11::string::~string((string *)&local_390);
                  std::allocator<char>::~allocator(&local_391);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::clear(&(this->super_BuildTest).command_runner_.commands_ran_);
                  State::Reset(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_);
                  pTVar1 = g_current_test;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3b8,"foo.o",&local_3b9);
                  pNVar6 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_3b8,
                                              (string *)local_30);
                  testing::Test::Check
                            (pTVar1,pNVar6 != (Node *)0x0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x42f,"builder_.AddTarget(\"foo.o\", &err)");
                  std::__cxx11::string::~string((string *)&local_3b8);
                  std::allocator<char>::~allocator(&local_3b9);
                  pTVar1 = g_current_test;
                  bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_30);
                  testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x430,"builder_.Build(&err)");
                  pTVar1 = g_current_test;
                  bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_30);
                  bVar3 = testing::Test::Check
                                    (pTVar1,bVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                     ,0x431,"\"\" == err");
                  pTVar1 = g_current_test;
                  if (bVar3) {
                    sVar7 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
                    bVar3 = testing::Test::Check
                                      (pTVar1,sVar7 == 1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                       ,0x432,"1u == command_runner_.commands_ran_.size()");
                    if (bVar3) {
                      edge._0_4_ = 0;
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      edge._0_4_ = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    edge._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  edge._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                edge._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              edge._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            edge._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          edge._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        edge._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      edge._0_4_ = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    edge._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(BuildTest, OrderOnlyDeps) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n  depfile = $out.d\n"
"build foo.o: cc foo.c || otherfile\n"));
  Edge* edge = state_.edges_.back();

  fs_.Create("foo.c", "");
  fs_.Create("otherfile", "");
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  ASSERT_EQ("", err);

  // One explicit, two implicit, one order only.
  ASSERT_EQ(4u, edge->inputs_.size());
  EXPECT_EQ(2, edge->implicit_deps_);
  EXPECT_EQ(1, edge->order_only_deps_);
  // Verify the inputs are in the order we expect
  // (explicit then implicit then orderonly).
  EXPECT_EQ("foo.c", edge->inputs_[0]->path());
  EXPECT_EQ("blah.h", edge->inputs_[1]->path());
  EXPECT_EQ("bar.h", edge->inputs_[2]->path());
  EXPECT_EQ("otherfile", edge->inputs_[3]->path());

  // Expect the command line we generate to only use the original input.
  ASSERT_EQ("cc foo.c", edge->EvaluateCommand());

  // explicit dep dirty, expect a rebuild.
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  fs_.Tick();

  // Recreate the depfile, as it should have been deleted by the build.
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");

  // implicit dep dirty, expect a rebuild.
  fs_.Create("blah.h", "");
  fs_.Create("bar.h", "");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  fs_.Tick();

  // Recreate the depfile, as it should have been deleted by the build.
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");

  // order only dep dirty, no rebuild.
  fs_.Create("otherfile", "");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  // implicit dep missing, expect rebuild.
  fs_.RemoveFile("bar.h");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}